

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

value_type_conflict1 __thiscall
protozero::const_varint_iterator<unsigned_long>::operator*
          (const_varint_iterator<unsigned_long> *this)

{
  assert_error *this_00;
  uint64_t uVar1;
  char *local_28;
  char *d;
  const_varint_iterator<unsigned_long> *local_10;
  const_varint_iterator<unsigned_long> *this_local;
  
  local_10 = this;
  if (this->m_data == (char *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
  }
  local_28 = this->m_data;
  uVar1 = decode_varint(&local_28,this->m_end);
  return uVar1;
}

Assistant:

value_type operator*() const {
        protozero_assert(m_data);
        const char* d = m_data; // will be thrown away
        return static_cast<value_type>(decode_varint(&d, m_end));
    }